

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O2

void rgbcx::encode_bc1(uint32_t level,void *pDst,uint8_t *pPixels,bool allow_3color,
                      bool allow_transparent_texels_for_black)

{
  uint32_t flags;
  uint32_t total_orderings_to_try3;
  uint32_t uStack_8;
  
  total_orderings_to_try3 = 1;
  uStack_8 = total_orderings_to_try3;
  switch(level) {
  case 0:
    flags = 0x8000;
    break;
  case 1:
    flags = 0x200;
    break;
  case 2:
    flags = 0;
    break;
  case 3:
    flags = 4;
    break;
  case 4:
    flags = 0x904;
    break;
  default:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 0x84;
    break;
  case 6:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 0x86;
    break;
  case 7:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 0x86;
    uStack_8 = 4;
    break;
  case 8:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 0x86;
    uStack_8 = 8;
    break;
  case 9:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 6;
    total_orderings_to_try3 = 3;
    uStack_8 = 0xb;
    break;
  case 10:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 6;
    total_orderings_to_try3 = 8;
    uStack_8 = 0x14;
    break;
  case 0xb:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 6;
    total_orderings_to_try3 = 0x10;
    uStack_8 = 0x1c;
    break;
  case 0xc:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 6;
    goto LAB_00114e74;
  case 0xd:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 0x5004906;
    goto LAB_00114e74;
  case 0xe:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 0x8004906;
    goto LAB_00114e74;
  case 0xf:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 0x8004906;
    total_orderings_to_try3 = 0x20;
    uStack_8 = 0x38;
    break;
  case 0x10:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 0x40004906;
    total_orderings_to_try3 = 0x20;
    uStack_8 = 0x50;
    break;
  case 0x11:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 0x40004906;
    goto LAB_00114f3d;
  case 0x12:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 0x40004926;
LAB_00114f3d:
    total_orderings_to_try3 = 0x20;
    uStack_8 = 0x80;
    break;
  case 0x13:
    flags = (uint)allow_3color * 0x10 + (uint)allow_transparent_texels_for_black * 8 + 0x40006926;
LAB_00114e74:
    total_orderings_to_try3 = 0x20;
    uStack_8 = total_orderings_to_try3;
  }
  encode_bc1(pDst,pPixels,flags,uStack_8,total_orderings_to_try3);
  return;
}

Assistant:

void encode_bc1(uint32_t level, void* pDst, const uint8_t* pPixels, bool allow_3color, bool allow_transparent_texels_for_black)
	{
		uint32_t flags = 0, total_orderings4 = 1, total_orderings3 = 1;

		static_assert(MAX_TOTAL_ORDERINGS3 >= 32, "MAX_TOTAL_ORDERINGS3 >= 32");
		static_assert(MAX_TOTAL_ORDERINGS4 >= 32, "MAX_TOTAL_ORDERINGS4 >= 32");

		switch (level)
		{
		case 0:
			// Faster/higher quality than stb_dxt default.
			flags = cEncodeBC1BoundingBoxInt;
			break;
		case 1:
			// Faster/higher quality than stb_dxt default. A bit higher average quality vs. mode 0.
			flags = cEncodeBC1Use2DLS;
			break;
		case 2:
			// On average mode 2 is a little weaker than modes 0/1, but it's stronger on outliers (very tough textures).
			// Slightly stronger than stb_dxt.
			flags = 0;
			break;
		case 3:
			// Slightly stronger than stb_dxt HIGHQUAL.
			flags = cEncodeBC1TwoLeastSquaresPasses;
			break;
		case 4:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseFullMSEEval | cEncodeBC1Use6PowerIters;
			break;
		default:
		case 5:
			// stb_dxt HIGHQUAL + permit 3 color (if it's enabled).
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseFasterMSEEval;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			break;
		case 6:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseFasterMSEEval | cEncodeBC1UseLikelyTotalOrderings;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			break;
		case 7:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseFasterMSEEval | cEncodeBC1UseLikelyTotalOrderings;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			total_orderings4 = 4;
			break;
		case 8:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseFasterMSEEval | cEncodeBC1UseLikelyTotalOrderings;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			total_orderings4 = 8;
			break;
		case 9:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseLikelyTotalOrderings;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			total_orderings4 = 11;
			total_orderings3 = 3;
			break;
		case 10:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseLikelyTotalOrderings;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			total_orderings4 = 20;
			total_orderings3 = 8;
			break;
		case 11:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseLikelyTotalOrderings;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			total_orderings4 = 28;
			total_orderings3 = 16;
			break;
		case 12:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseLikelyTotalOrderings;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			total_orderings4 = 32;
			total_orderings3 = 32;
			break;
		case 13:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseFullMSEEval | cEncodeBC1UseLikelyTotalOrderings | cEncodeBC1Use6PowerIters | (20 << cEncodeBC1EndpointSearchRoundsShift) | cEncodeBC1TryAllInitialEndponts;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			total_orderings4 = 32;
			total_orderings3 = 32;
			break;
		case 14:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseFullMSEEval | cEncodeBC1UseLikelyTotalOrderings | cEncodeBC1Use6PowerIters | (32 << cEncodeBC1EndpointSearchRoundsShift) | cEncodeBC1TryAllInitialEndponts;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			total_orderings4 = 32;
			total_orderings3 = 32;
			break;
		case 15:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseFullMSEEval | cEncodeBC1UseLikelyTotalOrderings | cEncodeBC1Use6PowerIters | (32 << cEncodeBC1EndpointSearchRoundsShift) | cEncodeBC1TryAllInitialEndponts;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			total_orderings4 = ((((32 + MAX_TOTAL_ORDERINGS4) / 2) + 32) / 2);
			total_orderings3 = 32;
			break;
		case 16:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseFullMSEEval | cEncodeBC1UseLikelyTotalOrderings | cEncodeBC1Use6PowerIters | (256 << cEncodeBC1EndpointSearchRoundsShift) | cEncodeBC1TryAllInitialEndponts;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			total_orderings4 = (32 + MAX_TOTAL_ORDERINGS4) / 2;
			total_orderings3 = 32;
			break;
		case 17:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseFullMSEEval | cEncodeBC1UseLikelyTotalOrderings | cEncodeBC1Use6PowerIters | (256 << cEncodeBC1EndpointSearchRoundsShift) | cEncodeBC1TryAllInitialEndponts;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			total_orderings4 = MAX_TOTAL_ORDERINGS4;
			total_orderings3 = 32;
			break;
		case 18:
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseFullMSEEval | cEncodeBC1UseLikelyTotalOrderings | cEncodeBC1Use6PowerIters | cEncodeBC1Iterative | (256 << cEncodeBC1EndpointSearchRoundsShift) | cEncodeBC1TryAllInitialEndponts;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			total_orderings4 = MAX_TOTAL_ORDERINGS4;
			total_orderings3 = 32;
			break;
		case 19:
			// This hidden mode is *extremely* slow and abuses the encoder. It's just for testing/training.
			flags = cEncodeBC1TwoLeastSquaresPasses | cEncodeBC1UseFullMSEEval | cEncodeBC1UseLikelyTotalOrderings | cEncodeBC1Use6PowerIters | cEncodeBC1Exhaustive | cEncodeBC1Iterative | (256 << cEncodeBC1EndpointSearchRoundsShift) | cEncodeBC1TryAllInitialEndponts;
			flags |= (allow_3color ? cEncodeBC1Use3ColorBlocks : 0) | (allow_transparent_texels_for_black ? cEncodeBC1Use3ColorBlocksForBlackPixels : 0);
			total_orderings4 = 32;
			total_orderings3 = 32;
			break;
		}

		encode_bc1(pDst, pPixels, flags, total_orderings4, total_orderings3);
	}